

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AStateProvider_A_FireBullets
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  AActor *pAVar2;
  APlayerPawn *this;
  undefined8 *puVar3;
  void *pvVar4;
  PClassActor *type;
  player_t *ppVar5;
  AWeapon *this_00;
  void *pvVar6;
  int iVar7;
  uint flags;
  uint uVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined8 uVar10;
  PClass *pPVar11;
  PClass *pPVar12;
  AActor *pAVar13;
  AActor *pAVar14;
  AActor *pAVar15;
  VMValue *pVVar16;
  VMValue *pVVar17;
  uint uVar18;
  char *pcVar19;
  int iVar20;
  int damage;
  bool bVar21;
  ulong uVar22;
  ulong uVar23;
  double dVar24;
  double dVar25;
  PClassActor *local_118;
  DThinker *local_f0;
  undefined4 local_d8;
  uint uStack_d4;
  FName local_c0;
  FName local_bc;
  void *local_b8;
  void *local_b0;
  void *local_a8;
  double local_a0;
  DAngle local_98;
  DAngle local_90;
  DAngle local_88;
  DAngle local_80;
  DAngle local_78;
  undefined1 local_70 [12];
  FName local_64;
  FName local_60;
  FSoundID local_5c;
  DAngle local_58;
  DAngle local_50;
  DAngle local_48;
  DAngle local_40;
  DAngle local_38;
  
  pPVar12 = AActor::RegistrationInfo.MyClass;
  if (0 < numparam) {
    if (((param->field_0).field_3.Type != '\x03') ||
       (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_003cc528:
      pcVar19 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_003cc63a;
    }
    this = *(APlayerPawn **)&param->field_0;
    uVar18 = numparam;
    if (this != (APlayerPawn *)0x0) {
      if ((this->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar7 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
        (this->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var,iVar7);
      }
      pPVar11 = (this->super_AActor).super_DThinker.super_DObject.Class;
      bVar21 = pPVar11 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar21;
      uVar18 = (uint)bVar21;
      if (pPVar11 != pPVar12 && !bVar21) {
        do {
          pPVar11 = pPVar11->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar11 != (PClass *)0x0);
          if (pPVar11 == pPVar12) break;
        } while (pPVar11 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        pcVar19 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003cc63a;
      }
    }
    pPVar12 = AStateProvider::RegistrationInfo.MyClass;
    if (numparam != 1) {
      if ((param[1].field_0.field_3.Type != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_003cc528;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar10 = (**(code **)*puVar3)(puVar3,defaultparam,uVar18,ret);
          puVar3[1] = uVar10;
        }
        pPVar11 = (PClass *)puVar3[1];
        bVar21 = pPVar11 != (PClass *)0x0;
        if (pPVar11 != pPVar12 && bVar21) {
          do {
            pPVar11 = pPVar11->ParentClass;
            bVar21 = pPVar11 != (PClass *)0x0;
            if (pPVar11 == pPVar12) break;
          } while (pPVar11 != (PClass *)0x0);
        }
        if (!bVar21) {
          pcVar19 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
          goto LAB_003cc63a;
        }
      }
      if (2 < numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            pcVar19 = "(paramnum) < numparam";
          }
          else {
            if (param[3].field_0.field_3.Type == '\x01') {
              if (numparam < 5) {
                pcVar19 = "(paramnum) < numparam";
              }
              else {
                if (param[4].field_0.field_3.Type == '\x01') {
                  if (numparam == 5) {
                    pcVar19 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[5].field_0.field_3.Type == '\0') {
                      if (numparam < 7) {
                        pcVar19 = "(paramnum) < numparam";
                      }
                      else {
                        if (param[6].field_0.field_3.Type == '\0') {
                          pvVar4 = param[2].field_0.field_1.a;
                          local_a8 = param[3].field_0.field_1.a;
                          local_b0 = param[4].field_0.field_1.a;
                          iVar7 = param[5].field_0.i;
                          damage = param[6].field_0.i;
                          if (numparam == 7) {
                            pVVar16 = defaultparam->Array;
                            if ((pVVar16[7].field_0.field_3.Type != '\x03') ||
                               ((pVVar17 = pVVar16 + 7, pVVar16[7].field_0.field_1.atag != 1 &&
                                ((pVVar17->field_0).field_1.a != (void *)0x0)))) {
                              pcVar19 = 
                              "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                              ;
LAB_003cc5f3:
                              __assert_fail(pcVar19,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                            ,0x74c,
                                            "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                           );
                            }
                          }
                          else if ((param[7].field_0.field_3.Type != '\x03') ||
                                  ((pVVar17 = param + 7, param[7].field_0.field_1.atag != 1 &&
                                   ((pVVar17->field_0).field_1.a != (void *)0x0)))) {
                            pcVar19 = 
                            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                            ;
                            goto LAB_003cc5f3;
                          }
                          local_118 = (PClassActor *)(pVVar17->field_0).field_1.a;
                          if (numparam < 9) {
                            pVVar17 = defaultparam->Array;
                            if (pVVar17[8].field_0.field_3.Type != '\0') {
                              pcVar19 = "(defaultparam[paramnum]).Type == REGT_INT";
                              goto LAB_003cc659;
                            }
                          }
                          else {
                            pVVar17 = param;
                            if (param[8].field_0.field_3.Type != '\0') {
                              pcVar19 = "(param[paramnum]).Type == REGT_INT";
LAB_003cc659:
                              __assert_fail(pcVar19,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                            ,0x74d,
                                            "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                           );
                            }
                          }
                          uVar18 = pVVar17[8].field_0.i;
                          if (numparam < 10) {
                            pVVar17 = defaultparam->Array;
                            if (pVVar17[9].field_0.field_3.Type != '\x01') {
                              pcVar19 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                              goto LAB_003cc678;
                            }
                          }
                          else {
                            pVVar17 = param;
                            if (param[9].field_0.field_3.Type != '\x01') {
                              pcVar19 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003cc678:
                              __assert_fail(pcVar19,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                            ,0x74e,
                                            "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                           );
                            }
                          }
                          dVar24 = pVVar17[9].field_0.f;
                          if (numparam < 0xb) {
                            pVVar17 = defaultparam->Array;
                            if ((pVVar17[10].field_0.field_3.Type != '\x03') ||
                               ((pVVar16 = pVVar17 + 10, pVVar17[10].field_0.field_1.atag != 1 &&
                                ((pVVar16->field_0).field_1.a != (void *)0x0)))) {
                              pcVar19 = 
                              "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                              ;
                              goto LAB_003cc612;
                            }
                          }
                          else if ((param[10].field_0.field_3.Type != '\x03') ||
                                  ((pVVar16 = param + 10, param[10].field_0.field_1.atag != 1 &&
                                   ((pVVar16->field_0).field_1.a != (void *)0x0)))) {
                            pcVar19 = 
                            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                            ;
LAB_003cc612:
                            __assert_fail(pcVar19,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                          ,0x74f,
                                          "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                         );
                          }
                          type = (PClassActor *)(pVVar16->field_0).field_1.a;
                          if (numparam < 0xc) {
                            pVVar17 = defaultparam->Array;
                            if (pVVar17[0xb].field_0.field_3.Type != '\x01') {
                              pcVar19 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                              goto LAB_003cc697;
                            }
                          }
                          else {
                            pVVar17 = param;
                            if (param[0xb].field_0.field_3.Type != '\x01') {
                              pcVar19 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003cc697:
                              __assert_fail(pcVar19,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                            ,0x750,
                                            "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                           );
                            }
                          }
                          local_b8 = pVVar17[0xb].field_0.field_1.a;
                          if (numparam < 0xd) {
                            param = defaultparam->Array;
                            if (param[0xc].field_0.field_3.Type != '\x01') {
                              pcVar19 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                              goto LAB_003cc6b6;
                            }
                          }
                          else if (param[0xc].field_0.field_3.Type != '\x01') {
                            pcVar19 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003cc6b6:
                            __assert_fail(pcVar19,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                          ,0x751,
                                          "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                         );
                          }
                          ppVar5 = (this->super_AActor).player;
                          if (ppVar5 != (player_t *)0x0) {
                            dVar1 = param[0xc].field_0.f;
                            this_00 = ppVar5->ReadyWeapon;
                            if ((((pvVar4 != (void *)0x0 & (byte)uVar18 & this_00 != (AWeapon *)0x0)
                                  != 1) || (*(int *)((long)pvVar4 + 8) != 1)) ||
                               (bVar21 = AWeapon::DepleteAmmo(this_00,this_00->bAltFire,true,-1),
                               bVar21)) {
                              local_f0 = (DThinker *)0x0;
                              uVar22 = -(ulong)(dVar24 == 0.0);
                              if ((uVar18 & 0x10) == 0) {
                                APlayerPawn::PlayAttacking2(this);
                              }
                              uVar23 = ~uVar22 & (ulong)dVar24;
                              local_d8 = (undefined4)uVar23;
                              uStack_d4 = (uint)(uVar23 >> 0x20);
                              if ((uVar18 & 8) == 0) {
                                P_BulletSlope((AActor *)local_70,(FTranslatedLineTarget *)this,0);
                                local_f0 = (DThinker *)CONCAT44(local_70._4_4_,local_70._0_4_);
                              }
                              uStack_d4 = uStack_d4 | (uint)(uVar22 >> 0x20) & 0x40c00000;
                              pAVar2 = (AActor *)(this->super_AActor).Angles.Yaw.Degrees;
                              if (local_118 == (PClassActor *)0x0) {
                                local_70._0_4_ = 0x40;
                                pPVar12 = PClass::FindClass((FName *)local_70);
                                local_118 = dyn_cast<PClassActor>((DObject *)pPVar12);
                              }
                              if (this_00 != (AWeapon *)0x0) {
                                local_5c.ID = (this_00->super_AStateProvider).super_AInventory.
                                              super_AActor.AttackSound.super_FSoundID.ID;
                                S_Sound(&this->super_AActor,1,&local_5c,1.0,1.0);
                              }
                              flags = uVar18 >> 4 & 2;
                              if ((iVar7 == 0) || ((iVar7 == 1 && (ppVar5->refire == 0)))) {
                                if ((uVar18 & 2) == 0) {
                                  uVar8 = FRandom::GenRand32(&pr_cwbullet);
                                  damage = damage * ((uVar8 & 0xff) % 3 + 1);
                                }
                                local_40.Degrees = (double)local_f0;
                                local_60.Index = 0xcd;
                                local_38.Degrees = (double)pAVar2;
                                pAVar13 = P_LineAttack(&this->super_AActor,&local_38,
                                                       (double)CONCAT44(uStack_d4,local_d8),
                                                       &local_40,damage,&local_60,local_118,flags,
                                                       (FTranslatedLineTarget *)0x0,(int *)0x0);
                                if (type != (PClassActor *)0x0) {
                                  dVar24 = FFastTrig::cos(&fasttrig,
                                                          ((this->super_AActor).Angles.Yaw.Degrees +
                                                          -90.0) * 11930464.711111112 +
                                                          6755399441055744.0);
                                  dVar25 = FFastTrig::sin(&fasttrig,dVar24 * dVar1);
                                  local_48.Degrees = (double)pAVar2;
                                  pAVar14 = P_SpawnPlayerMissile
                                                      (&this->super_AActor,dVar24 * dVar1,
                                                       dVar1 * dVar25,(double)local_b8,type,
                                                       &local_48,(FTranslatedLineTarget *)0x0,
                                                       (AActor **)0x0,false,true,0);
                                  if (pAVar14 != (AActor *)0x0) {
                                    pAVar15 = pAVar13;
                                    if (pAVar13 == (AActor *)0x0) {
                                      local_58.Degrees = (double)local_f0;
                                      local_64.Index = 0xcd;
                                      local_50.Degrees = (double)pAVar2;
                                      pAVar15 = P_LineAttack(&this->super_AActor,&local_50,
                                                             (double)CONCAT44(uStack_d4,local_d8),
                                                             &local_58,0,&local_64,local_118,
                                                             flags | 8,(FTranslatedLineTarget *)0x0,
                                                             (int *)0x0);
                                    }
                                    AimBulletMissile(pAVar14,pAVar15,uVar18,pAVar13 == (AActor *)0x0
                                                     ,false);
                                  }
                                }
                              }
                              else {
                                iVar20 = 1;
                                if (-1 < iVar7) {
                                  iVar20 = iVar7;
                                }
                                if (iVar20 != 0) {
                                  do {
                                    pvVar4 = local_a8;
                                    pvVar6 = local_b0;
                                    if ((uVar18 & 4) == 0) {
                                      uVar8 = FRandom::GenRand32(&pr_cwbullet);
                                      uVar9 = FRandom::GenRand32(&pr_cwbullet);
                                      pvVar4 = (void *)(((double)(int)((uVar8 & 0xff) -
                                                                      (uVar9 & 0xff)) / 255.0) *
                                                       (double)local_a8);
                                      uVar8 = FRandom::GenRand32(&pr_cwbullet);
                                      uVar9 = FRandom::GenRand32(&pr_cwbullet);
                                      pvVar6 = (void *)(((double)(int)((uVar8 & 0xff) -
                                                                      (uVar9 & 0xff)) / 255.0) *
                                                       (double)local_b0);
                                    }
                                    iVar7 = damage;
                                    if ((uVar18 & 2) == 0) {
                                      uVar8 = FRandom::GenRand32(&pr_cwbullet);
                                      iVar7 = ((uVar8 & 0xff) % 3 + 1) * damage;
                                    }
                                    dVar24 = (double)pvVar4 + (double)pAVar2;
                                    local_bc.Index = 0xcd;
                                    local_80.Degrees = (double)pvVar6 + (double)local_f0;
                                    local_78.Degrees = dVar24;
                                    pAVar13 = P_LineAttack(&this->super_AActor,&local_78,
                                                           (double)CONCAT44(uStack_d4,local_d8),
                                                           &local_80,iVar7,&local_bc,local_118,flags
                                                           ,(FTranslatedLineTarget *)0x0,(int *)0x0)
                                    ;
                                    if (type != (PClassActor *)0x0) {
                                      local_a0 = FFastTrig::cos(&fasttrig,
                                                                ((this->super_AActor).Angles.Yaw.
                                                                 Degrees + -90.0) *
                                                                11930464.711111112 +
                                                                6755399441055744.0);
                                      local_a0 = local_a0 * dVar1;
                                      dVar25 = FFastTrig::sin(&fasttrig,local_a0);
                                      local_88.Degrees = dVar24;
                                      pAVar14 = P_SpawnPlayerMissile
                                                          (&this->super_AActor,local_a0,
                                                           dVar25 * dVar1,(double)local_b8,type,
                                                           &local_88,(FTranslatedLineTarget *)0x0,
                                                           (AActor **)0x0,false,true,0);
                                      if (pAVar14 != (AActor *)0x0) {
                                        pAVar15 = pAVar13;
                                        if (pAVar13 == (AActor *)0x0) {
                                          local_c0.Index = 0xcd;
                                          local_98.Degrees = (double)pvVar6 + (double)local_f0;
                                          local_90.Degrees = dVar24;
                                          pAVar15 = P_LineAttack(&this->super_AActor,&local_90,
                                                                 (double)CONCAT44(uStack_d4,local_d8
                                                                                 ),&local_98,0,
                                                                 &local_c0,local_118,flags + 8,
                                                                 (FTranslatedLineTarget *)0x0,
                                                                 (int *)0x0);
                                        }
                                        AimBulletMissile(pAVar14,pAVar15,uVar18,
                                                         pAVar13 == (AActor *)0x0,false);
                                      }
                                    }
                                    iVar20 = iVar20 + -1;
                                  } while (iVar20 != 0);
                                }
                              }
                            }
                          }
                          return 0;
                        }
                        pcVar19 = "param[paramnum].Type == REGT_INT";
                      }
                      __assert_fail(pcVar19,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                    ,0x74b,
                                    "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    pcVar19 = "param[paramnum].Type == REGT_INT";
                  }
                  __assert_fail(pcVar19,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x74a,
                                "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar19 = "param[paramnum].Type == REGT_FLOAT";
              }
              __assert_fail(pcVar19,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x749,
                            "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar19 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar19,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x748,
                        "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar19 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_003cc63a;
      }
    }
  }
  pcVar19 = "(paramnum) < numparam";
LAB_003cc63a:
  __assert_fail(pcVar19,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x747,
                "int AF_AStateProvider_A_FireBullets(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_FireBullets)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_ANGLE		(spread_xy);
	PARAM_ANGLE		(spread_z);
	PARAM_INT		(numbullets);
	PARAM_INT		(damageperbullet);
	PARAM_CLASS_DEF	(pufftype, AActor);
	PARAM_INT_DEF	(flags);
	PARAM_FLOAT_DEF	(range);
	PARAM_CLASS_DEF (missile, AActor);
	PARAM_FLOAT_DEF (Spawnheight);
	PARAM_FLOAT_DEF (Spawnofs_xy);

	if (!self->player) return 0;

	player_t *player = self->player;
	AWeapon *weapon = player->ReadyWeapon;

	int i;
	DAngle bangle;
	DAngle bslope = 0.;
	int laflags = (flags & FBF_NORANDOMPUFFZ)? LAF_NORANDOMPUFFZ : 0;

	if ((flags & FBF_USEAMMO) && weapon && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo(weapon->bAltFire, true))
			return 0;	// out of ammo
	}
	
	if (range == 0)	range = PLAYERMISSILERANGE;

	if (!(flags & FBF_NOFLASH)) static_cast<APlayerPawn *>(self)->PlayAttacking2 ();

	if (!(flags & FBF_NOPITCH)) bslope = P_BulletSlope(self);
	bangle = self->Angles.Yaw;

	if (pufftype == NULL) pufftype = PClass::FindActor(NAME_BulletPuff);

	if (weapon != NULL)
	{
		S_Sound(self, CHAN_WEAPON, weapon->AttackSound, 1, ATTN_NORM);
	}

	if ((numbullets == 1 && !player->refire) || numbullets == 0)
	{
		int damage = damageperbullet;

		if (!(flags & FBF_NORANDOM))
			damage *= ((pr_cwbullet()%3)+1);

		AActor *puff = P_LineAttack(self, bangle, range, bslope, damage, NAME_Hitscan, pufftype, laflags);

		if (missile != nullptr)
		{
			bool temp = false;
			DAngle ang = self->Angles.Yaw - 90;
			DVector2 ofs = ang.ToVector(Spawnofs_xy);
			AActor *proj = P_SpawnPlayerMissile(self, ofs.X, ofs.Y, Spawnheight, missile, bangle, nullptr, nullptr, false, true);
			if (proj)
			{
				if (!puff)
				{
					temp = true;
					puff = P_LineAttack(self, bangle, range, bslope, 0, NAME_Hitscan, pufftype, laflags | LAF_NOINTERACT);
				}
				AimBulletMissile(proj, puff, flags, temp, false);
			}
		}
	}
	else 
	{
		if (numbullets < 0)
			numbullets = 1;
		for (i = 0; i < numbullets; i++)
		{
			DAngle angle = bangle;
			DAngle slope = bslope;

			if (flags & FBF_EXPLICITANGLE)
			{
				angle += spread_xy;
				slope += spread_z;
			}
			else
			{
				angle += spread_xy * (pr_cwbullet.Random2() / 255.);
				slope += spread_z * (pr_cwbullet.Random2() / 255.);
			}

			int damage = damageperbullet;

			if (!(flags & FBF_NORANDOM))
				damage *= ((pr_cwbullet()%3)+1);

			AActor *puff = P_LineAttack(self, angle, range, slope, damage, NAME_Hitscan, pufftype, laflags);

			if (missile != nullptr)
			{
				bool temp = false;
				DAngle ang = self->Angles.Yaw - 90;
				DVector2 ofs = ang.ToVector(Spawnofs_xy);
				AActor *proj = P_SpawnPlayerMissile(self, ofs.X, ofs.Y, Spawnheight, missile, angle, nullptr, nullptr, false, true);
				if (proj)
				{
					if (!puff)
					{
						temp = true;
						puff = P_LineAttack(self, angle, range, slope, 0, NAME_Hitscan, pufftype, laflags | LAF_NOINTERACT);
					}
					AimBulletMissile(proj, puff, flags, temp, false);
				}
			}
		}
	}
	return 0;
}